

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

void __thiscall
MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod(MemoryLeakDetector *this)

{
  MemoryLeakDetectorNode *leak;
  long lVar1;
  MemoryLeakDetectorNode *cur;
  
  lVar1 = 0;
  do {
    for (leak = (this->memoryTable_).table_[lVar1].head_;
        (leak != (MemoryLeakDetectorNode *)0x0 && (*(int *)(leak + 0x30) != 3));
        leak = *(MemoryLeakDetectorNode **)(leak + 0x38)) {
    }
    if (leak != (MemoryLeakDetectorNode *)0x0) goto LAB_0023ed61;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x49);
  leak = (MemoryLeakDetectorNode *)0x0;
LAB_0023ed61:
  for (; leak != (MemoryLeakDetectorNode *)0x0;
      leak = MemoryLeakDetectorTable::getNextLeak(&this->memoryTable_,leak,mem_leak_period_checking)
      ) {
    if (*(int *)(leak + 0x30) == 3) {
      *(undefined4 *)(leak + 0x30) = 2;
    }
  }
  return;
}

Assistant:

void MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod()
{
    MemoryLeakDetectorNode* leak = memoryTable_.getFirstLeak(mem_leak_period_checking);
    while (leak) {
        if (leak->period_ == mem_leak_period_checking) leak->period_ = mem_leak_period_enabled;
        leak = memoryTable_.getNextLeak(leak, mem_leak_period_checking);
    }
}